

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareB44.cpp
# Opt level: O0

void compareB44(int width,int height,Array2D<Imath_3_2::half> *p1,Array2D<Imath_3_2::half> *p2)

{
  bool bVar1;
  int *piVar2;
  half *phVar3;
  Array2D<Imath_3_2::half> *in_RCX;
  Array2D<Imath_3_2::half> *in_RDX;
  int in_ESI;
  int in_EDI;
  int x2;
  int y2;
  int x1;
  int y1;
  half B [4] [4];
  half A [4] [4];
  int x;
  int y;
  half (*in_stack_00000090) [4];
  half (*in_stack_00000098) [4];
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  uint16_t local_68 [16];
  uint16_t local_48 [20];
  int local_20;
  int local_1c;
  Array2D<Imath_3_2::half> *local_18;
  Array2D<Imath_3_2::half> *local_10;
  int local_8;
  int local_4;
  
  local_1c = 0;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  do {
    if (local_8 <= local_1c) {
      return;
    }
    for (local_20 = 0; local_20 < local_4; local_20 = local_20 + 4) {
      for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
        for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
          local_78 = local_1c + local_6c;
          local_7c = local_8 + -1;
          piVar2 = std::min<int>(&local_78,&local_7c);
          local_74 = *piVar2;
          local_84 = local_20 + local_70;
          local_88 = local_4 + -1;
          piVar2 = std::min<int>(&local_84,&local_88);
          local_80 = *piVar2;
          phVar3 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](local_10,(long)local_74);
          local_48[(long)local_6c * 4 + (long)local_70] = phVar3[local_80]._h;
          phVar3 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](local_18,(long)local_74);
          local_68[(long)local_6c * 4 + (long)local_70] = phVar3[local_80]._h;
        }
      }
      bVar1 = withinB44ErrorBounds(in_stack_00000098,in_stack_00000090);
      if (!bVar1) {
        __assert_fail("withinB44ErrorBounds (A, B)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                      ,0xc4,
                      "void compareB44(int, int, const Array2D<half> &, const Array2D<half> &)");
      }
    }
    local_1c = local_1c + 4;
  } while( true );
}

Assistant:

void
compareB44 (
    int width, int height, const Array2D<half>& p1, const Array2D<half>& p2)
{
    for (int y = 0; y < height; y += 4)
    {
        for (int x = 0; x < width; x += 4)
        {
            half A[4][4];
            half B[4][4];

            for (int y1 = 0; y1 < 4; ++y1)
            {
                for (int x1 = 0; x1 < 4; ++x1)
                {
                    int y2    = min (y + y1, height - 1);
                    int x2    = min (x + x1, width - 1);
                    A[y1][x1] = p1[y2][x2];
                    B[y1][x1] = p2[y2][x2];
                }
            }

            assert (withinB44ErrorBounds (A, B));
        }
    }
}